

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternGridHeader.cpp
# Opt level: O2

void __thiscall PatternGridHeader::paintEvent(PatternGridHeader *this,QPaintEvent *evt)

{
  QColor *pQVar1;
  uint uVar2;
  ColorRole cr;
  int iVar3;
  int iVar4;
  int iVar5;
  QPalette *this_00;
  QColor *pQVar6;
  int iVar7;
  int y2;
  uint track;
  int w;
  int x;
  QColor *color;
  QPainter painter;
  QPen textPen;
  QArrayDataPointer<char16_t> local_90;
  QColor widgetbg;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_48;
  
  if (this->mLayout != (PatternLayout *)0x0) {
    QPainter::QPainter(&painter,(QPaintDevice *)&this->field_0x10);
    pQVar1 = &this->mColorForeground1;
    QPen::QPen(&textPen,pQVar1);
    this_00 = (QPalette *)QWidget::palette();
    cr = QWidget::backgroundRole();
    pQVar6 = QPalette::color(this_00,cr);
    widgetbg._0_8_ = *(undefined8 *)pQVar6;
    widgetbg._8_8_ = *(undefined8 *)((long)&pQVar6->ct + 4);
    iVar7 = *(int *)(*(long *)&this->field_0x20 + 0x20) -
            *(int *)(*(long *)&this->field_0x20 + 0x18);
    iVar3 = PatternLayout::patternStart(this->mLayout);
    y2 = iVar7 + 1;
    iVar3 = iVar3 + -1;
    track = 0;
    while( true ) {
      if (track == 4) break;
      iVar4 = PatternLayout::trackWidth(this->mLayout,track);
      QPainter::setPen((QPen *)&painter);
      QPainter::drawLine(&painter,iVar3,0,iVar3,y2);
      QPainter::fillRect(&painter,iVar3 + 2,0,iVar4 + -1,y2,&this->mColorBackground);
      uVar2 = (this->mTrackFlags).i;
      x = iVar3 + 4;
      w = iVar4 + -5;
      QPainter::fillRect(&painter,x,2,w,4,
                         &this->mColorEnabled + ((uVar2 >> (track & 0x1f) & 1) == 0));
      pQVar6 = pQVar1;
      color = pQVar1;
      if (track == this->mTrackHover) {
        QPainter::fillRect(&painter,x,iVar7 + -1,w,1,
                           &this->mColorEnabled + ((uVar2 >> (track & 0x1f) & 1) == 0));
        color = &this->mColorForeground2;
        if ((this->mHoverKind != addEffect) && (color = pQVar1, this->mHoverKind == removeEffect)) {
          pQVar6 = &this->mColorForeground2;
        }
      }
      iVar5 = PatternLayout::effectsVisible(this->mLayout,track);
      if (iVar5 == 3) {
        color = &widgetbg;
      }
      PatternGridHeaderTU::drawPlus(&painter,x,color);
      if (iVar5 == 1) {
        pQVar6 = &widgetbg;
      }
      PatternGridHeaderTU::drawMinus(&painter,x,pQVar6);
      QPainter::setPen((QPen *)&painter);
      local_90.d = (Data *)0x0;
      local_90.ptr = L"CH%1";
      local_90.size = 4;
      local_68.d = (Data *)0x0;
      local_68.ptr = (char16_t *)0x0;
      local_68.size = 0;
      track = track + 1;
      QString::arg((QString *)&local_48,(QString *)&local_90,track,0,10,(QChar)0x20);
      QPainter::drawText(&painter,x,8,w,0xc,0x84,(QString *)&local_48,(QRect *)0x0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
      iVar3 = iVar3 + 1 + iVar4;
    }
    QPainter::setPen((QPen *)&painter);
    QPainter::drawLine(&painter,iVar3,0,iVar3,y2);
    QPen::~QPen(&textPen);
    QPainter::~QPainter(&painter);
  }
  return;
}

Assistant:

void PatternGridHeader::paintEvent(QPaintEvent *evt) {

    Q_UNUSED(evt);

    if (mLayout == nullptr) {
        return;
    }

    QPainter painter(this);
    QPen textPen(mColorForeground1);

    QColor widgetbg = palette().color(backgroundRole());

    auto const h = height();

    int xpos = mLayout->patternStart() - PatternLayout::LINE_WIDTH;
    for (int track = 0; track < 4; ++track) {

        auto const trackWidth = mLayout->trackWidth(track);

        painter.setPen(mLinePen);
        painter.drawLine(xpos, 0, xpos, h);
        xpos += PatternLayout::LINE_WIDTH;

        // background color
        painter.fillRect(xpos + 1, 0, trackWidth - 1, h, mColorBackground);

        bool const isPlaying = (mTrackFlags & (1 << track));
        auto const& statusColor = isPlaying ? mColorEnabled : mColorDisabled;
        auto const contentX = xpos + TU::TRACK_PADDING;
        auto const contentWidth = trackWidth - 5;
        painter.fillRect(contentX, 2, contentWidth, 4, statusColor);

        QColor *plusColor, *minusColor;
        plusColor = minusColor = &mColorForeground1;


        if (mTrackHover == track) {
            painter.fillRect(contentX, h - 2, contentWidth, 1, statusColor);
            switch (mHoverKind) {
                case HoverKind::track:
                    break;
                case HoverKind::addEffect:
                    plusColor = &mColorForeground2;
                    break;
                case HoverKind::removeEffect:
                    minusColor = &mColorForeground2;
                    break;
            }
        }
        
        auto const effectsVisible = mLayout->effectsVisible(track);
        TU::drawPlus(painter, contentX, effectsVisible != 3 ? *plusColor : widgetbg);
        TU::drawMinus(painter, contentX, effectsVisible != 1 ? *minusColor : widgetbg);

        // text
        painter.setPen(textPen);
        constexpr int textY = 8;
        painter.drawText(contentX, textY, contentWidth, 12, Qt::AlignCenter, QStringLiteral("CH%1").arg(track + 1));

        xpos += trackWidth;
    }

    painter.setPen(mLinePen);
    painter.drawLine(xpos, 0, xpos, h);
    

}